

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O3

int __thiscall ON_BinaryArchive::Read3dmMaterial(ON_BinaryArchive *this,ON_Material **ppMaterial)

{
  ON_Material *pOVar1;
  bool bVar2;
  int iVar3;
  ON_Material *this_00;
  int iVar4;
  ON_Material *V1_material;
  ON__UINT32 tcode;
  ON__INT64 big_value;
  ON_Material *local_40;
  uint local_34;
  ON__INT64 local_30;
  
  bVar2 = Read3dmTableRecord(this,material_table,ppMaterial);
  if (!bVar2) {
    return 0;
  }
  local_34 = 0;
  local_30 = 0;
  if (this->m_3dm_version == 1) {
    local_40 = (ON_Material *)0x0;
    iVar3 = Read3dmV1Material(this,&local_40);
    if (local_40 == (ON_Material *)0x0) {
      return iVar3;
    }
    bVar2 = ON_ModelComponent::IdIsNil(&local_40->super_ON_ModelComponent);
    if (bVar2) {
      ON_ModelComponent::SetId(&local_40->super_ON_ModelComponent);
    }
    Internal_Read3dmUpdateManifest(this,&local_40->super_ON_ModelComponent);
    if (ppMaterial != (ON_Material **)0x0) {
      *ppMaterial = local_40;
      return iVar3;
    }
    if (local_40 == (ON_Material *)0x0) {
      return iVar3;
    }
    (*(local_40->super_ON_ModelComponent).super_ON_Object._vptr_ON_Object[4])();
    return iVar3;
  }
  bVar2 = BeginRead3dmBigChunk(this,&local_34,&local_30);
  if (!bVar2) {
    return -1;
  }
  if (local_34 == 0xffffffff) {
    iVar3 = 0;
  }
  else {
    if (local_34 == 0x20008040) {
      Internal_Increment3dmTableItemCount(this);
      local_40 = (ON_Material *)0x0;
      iVar3 = ReadObjectHelper(this,(ON_Object **)&local_40);
      pOVar1 = local_40;
      if (iVar3 != 0) {
        this_00 = ON_Material::Cast((ON_Object *)local_40);
        if (this_00 != (ON_Material *)0x0) {
          bVar2 = ON_ModelComponent::IdIsNil(&this_00->super_ON_ModelComponent);
          if (bVar2) {
            ON_ModelComponent::SetId(&this_00->super_ON_ModelComponent);
          }
          Internal_Read3dmUpdateManifest(this,&this_00->super_ON_ModelComponent);
          iVar3 = 1;
          if (ppMaterial != (ON_Material **)0x0) {
            *ppMaterial = this_00;
          }
          goto LAB_003a535c;
        }
        if (pOVar1 != (ON_Material *)0x0) {
          (*(pOVar1->super_ON_ModelComponent).super_ON_Object._vptr_ON_Object[4])(pOVar1);
        }
      }
      iVar3 = 0x31e2;
    }
    else {
      iVar3 = 0x31ec;
    }
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
               ,iVar3,"","ON_BinaryArchive::Read3dmMaterial() - corrupt material table");
    iVar3 = -1;
  }
LAB_003a535c:
  bVar2 = EndRead3dmChunk(this,false);
  iVar4 = -1;
  if (bVar2) {
    iVar4 = iVar3;
  }
  return iVar4;
}

Assistant:

int ON_BinaryArchive::Read3dmMaterial( ON_Material** ppMaterial )
{
  if ( false == Read3dmTableRecord(ON_3dmArchiveTableType::material_table, (void**)ppMaterial))
    return 0;

  int rc;
  ON_Material* material = nullptr;
  ON__UINT32 tcode = 0;
  ON__INT64 big_value = 0;
  if ( m_3dm_version == 1 ) 
  {
    ON_Material* V1_material = nullptr;
    rc = ON_BinaryArchive::Read3dmV1Material( &V1_material );
    if (nullptr != V1_material)
    {
      if ( V1_material->IdIsNil() )
        V1_material->SetId();
      Internal_Read3dmUpdateManifest(*V1_material);
      if (ppMaterial)
        *ppMaterial = V1_material;
      else
        delete V1_material;
    }
  }
  else 
  {
    // version 2+
    rc = -1;
    if ( BeginRead3dmBigChunk( &tcode, &big_value ) )
    {
      if ( tcode == TCODE_MATERIAL_RECORD ) 
      {
        Internal_Increment3dmTableItemCount();
        ON_Object* p = 0;
        if ( ReadObject( &p ) ) 
        {
          material = ON_Material::Cast(p);
          if ( !material )
            delete p;
          else 
          {
            if ( material->IdIsNil() )
              material->SetId();
            Internal_Read3dmUpdateManifest(*material);
            if ( ppMaterial )
              *ppMaterial = material;
            rc = 1;
          }
        }
        if (!material)
        {
          ON_ERROR("ON_BinaryArchive::Read3dmMaterial() - corrupt material table");
        }
      }
      else if ( tcode == TCODE_ENDOFTABLE ) 
      {
        // end of material table
        rc = 0;
      }
      else 
      {
        ON_ERROR("ON_BinaryArchive::Read3dmMaterial() - corrupt material table");
      }
      if ( !EndRead3dmChunk() )
        rc = -1;
    }
  }
  return rc;
}